

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.cpp
# Opt level: O0

void __thiscall pstd::pmr::NewDeleteResource::NewDeleteResource(NewDeleteResource *this)

{
  memory_resource *in_RDI;
  
  memory_resource::memory_resource(in_RDI);
  in_RDI->_vptr_memory_resource = (_func_int **)&PTR__NewDeleteResource_0395bd98;
  return;
}

Assistant:

void *do_allocate(size_t size, size_t alignment) {
#if defined(PBRT_HAVE__ALIGNED_MALLOC)
        return _aligned_malloc(size, alignment);
#elif defined(PBRT_HAVE_POSIX_MEMALIGN)
        void *ptr;
        if (alignment < sizeof(void *))
            return malloc(size);
        if (posix_memalign(&ptr, alignment, size) != 0)
            ptr = nullptr;
        return ptr;
#else
        return memalign(alignment, size);
#endif
    }